

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::updateSurpluses<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,MultiIndexSet *work,int max_level,
          vector<int,_std::allocator<int>_> *level,Data2D<int> *dagUp)

{
  vector<int,std::allocator<int>> *this_00;
  int iVar1;
  int iVar2;
  iterator __position;
  pointer piVar3;
  pointer piVar4;
  size_t sVar5;
  pointer pdVar6;
  pointer pdVar7;
  GridLocalPolynomial *pGVar8;
  ulong *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  double dVar19;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<double,_std::allocator<double>_> x;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  indexses_for_levels;
  bool local_119;
  int local_118;
  allocator_type local_111;
  ulong local_110;
  GridLocalPolynomial *local_108;
  undefined8 local_100;
  undefined4 local_f8;
  ulong *local_f0;
  int local_e8;
  long local_e0;
  MultiIndexSet *local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  ulong local_88;
  size_type local_80;
  ulong local_78;
  long local_70;
  Data2D<int> *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  iVar14 = work->cache_num_indexes;
  local_118 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_d8 = work;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,(long)max_level + 1,(allocator_type *)&local_100);
  local_100 = (ulong *)((ulong)local_100._4_4_ << 0x20);
  if (0 < (long)iVar14) {
    iVar10 = 0;
    do {
      lVar12 = (long)(level->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar10];
      if (0 < lVar12) {
        this_00 = (vector<int,std::allocator<int>> *)
                  (local_48.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar12);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,(int *)&local_100);
        }
        else {
          *__position._M_current = iVar10;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      iVar10 = (int)local_100 + 1;
      local_100 = (ulong *)CONCAT44(local_100._4_4_,iVar10);
    } while (iVar10 < iVar14);
  }
  if (0 < max_level) {
    local_118 = local_118 * 2;
    uVar16 = (ulong)(max_level + 1);
    uVar18 = 1;
    local_108 = this;
    local_88 = uVar16;
    local_80 = (long)iVar14;
    local_68 = dagUp;
    do {
      local_70 = uVar18 * 3;
      piVar3 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar4 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      ::std::vector<double,_std::allocator<double>_>::vector
                (&local_a0,(long)(this->super_BaseCanonicalGrid).num_dimensions,
                 (allocator_type *)&local_100);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_b8,uVar16,(allocator_type *)&local_100);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_d0,uVar16,(allocator_type *)&local_100);
      local_119 = false;
      local_78 = uVar18;
      ::std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_100,local_80,&local_119,&local_111);
      local_110 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
      if (0 < (int)(uint)local_110) {
        local_110 = (ulong)((uint)local_110 & 0x7fffffff);
        uVar16 = 0;
        do {
          iVar14 = (&((local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start)[local_70][uVar16];
          local_60 = uVar16;
          if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
            sVar5 = local_d8->num_dimensions;
            piVar3 = (local_d8->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = 0;
            do {
              dVar19 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                 (piVar3[sVar5 * (long)iVar14 + lVar12]);
              local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = dVar19;
              lVar12 = lVar12 + 1;
            } while (lVar12 < (this->super_BaseCanonicalGrid).num_dimensions);
          }
          iVar10 = local_e8;
          puVar9 = local_f0;
          puVar17 = local_100;
          if (local_100 != local_f0) {
            memset(local_100,0,(long)local_f0 - (long)local_100);
            puVar17 = puVar9;
          }
          if (iVar10 != 0) {
            *puVar17 = *puVar17 & ~(0xffffffffffffffffU >> (-(char)iVar10 & 0x3fU));
          }
          lVar12 = (this->surpluses).stride * (long)iVar14;
          pdVar6 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start = 0;
          *local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start = iVar14;
          if (*local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start < local_118) {
            iVar10 = 0;
            iVar14 = local_118;
            do {
              pGVar8 = local_108;
              iVar1 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10];
              if (iVar1 < iVar14) {
                iVar2 = (dagUp->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar10] * dagUp->stride +
                         (long)iVar1];
                uVar16 = (ulong)iVar2;
                if (uVar16 != 0xffffffffffffffff) {
                  uVar18 = uVar16 + 0x3f;
                  if (-1 < (long)uVar16) {
                    uVar18 = uVar16;
                  }
                  uVar15 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
                  if ((local_100[((long)uVar18 >> 6) + (uVar15 - 1)] >> (uVar16 & 0x3f) & 1) == 0) {
                    sVar5 = (local_108->surpluses).stride;
                    pdVar7 = (local_108->surpluses).vec.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_58 = 1L << ((byte)iVar2 & 0x3f);
                    local_50 = uVar15;
                    dVar19 = evalBasisRaw<(TasGrid::RuleLocal::erule)2>
                                       (local_108,
                                        (local_d8->indexes).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                        local_d8->num_dimensions * uVar16,
                                        local_a0.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    lVar11 = (long)(pGVar8->super_BaseCanonicalGrid).num_outputs;
                    if (0 < lVar11) {
                      lVar13 = 0;
                      do {
                        pdVar6[lVar12 + lVar13] =
                             pdVar7[sVar5 * uVar16 + lVar13] * -dVar19 + pdVar6[lVar12 + lVar13];
                        lVar13 = lVar13 + 1;
                      } while (lVar11 != lVar13);
                    }
                    local_100[((long)uVar18 >> 6) + (local_50 - 1)] =
                         local_100[((long)uVar18 >> 6) + (local_50 - 1)] | local_58;
                    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar10 + 1] = 0;
                    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar10 + 1] = iVar2;
                    dagUp = local_68;
                    this = local_108;
                    iVar14 = local_118;
                    iVar10 = iVar10 + 1;
                    goto LAB_0019079b;
                  }
                }
                local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10] = iVar1 + 1;
                this = local_108;
              }
              else {
                local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar10 + -1] =
                     local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)iVar10 + -1] + 1;
                iVar10 = iVar10 + -1;
              }
LAB_0019079b:
            } while (*local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start < iVar14);
          }
          uVar16 = local_60 + 1;
        } while (uVar16 != local_110);
      }
      if (local_100 != (ulong *)0x0) {
        operator_delete(local_100,local_e0 - (long)local_100);
        local_100 = (ulong *)0x0;
        local_f8 = 0;
        local_f0 = (ulong *)0x0;
        local_e8 = 0;
        local_e0 = 0;
      }
      uVar18 = local_78;
      uVar16 = local_88;
      if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar16);
  }
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void GridLocalPolynomial::updateSurpluses(MultiIndexSet const &work, int max_level, std::vector<int> const &level, Data2D<int> const &dagUp){
    int num_points = work.getNumIndexes();
    int max_parents = num_dimensions * RuleLocal::getMaxNumParents<effrule>();

    std::vector<std::vector<int>> indexses_for_levels((size_t) max_level+1);
    for(int i=0; i<num_points; i++)
        if (level[i] > 0) indexses_for_levels[level[i]].push_back(i);

    for(int l=1; l<=max_level; l++){
        int level_size = (int) indexses_for_levels[l].size();
        #pragma omp parallel
        {
            std::vector<double> x(num_dimensions);

            std::vector<int> monkey_count(max_level + 1);
            std::vector<int> monkey_tail(max_level + 1);
            std::vector<bool> used(num_points, false);

            #pragma omp for schedule(dynamic)
            for(int s=0; s<level_size; s++){
                int i = indexses_for_levels[l][s];

                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    x[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                double *surpi = surpluses.getStrip(i);

                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || (used[branch])){
                            monkey_count[current]++;
                        }else{
                            const double *branch_surp = surpluses.getStrip(branch);
                            double basis_value = evalBasisRaw<effrule>(work.getIndex(branch), x.data());
                            for(int k=0; k<num_outputs; k++)
                                surpi[k] -= basis_value * branch_surp[k];
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            } // for-loop
        } // omp parallel
    } // level loop
}